

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visualOutput.cpp
# Opt level: O1

void __thiscall visualOutput::takeValue(visualOutput *this)

{
  outputArrow *poVar1;
  iterator __position;
  pointer piVar2;
  int *piVar3;
  WINDOW *pWVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  undefined1 auVar9 [16];
  int val;
  int local_1c;
  
  poVar1 = (this->super_output).outArr;
  iVar5 = (*(poVar1->super_arrowType)._vptr_arrowType[2])(poVar1,0xfffffffe);
  local_1c = (int)(short)iVar5;
  __position._M_current =
       (this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->in,__position,&local_1c);
  }
  else {
    *__position._M_current = local_1c;
    (this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  if ((local_1c == -1) &&
     (piVar2 = (this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
     (this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish != piVar2)) {
    (this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  piVar3 = (this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  uVar7 = (long)(this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
  if ((2 < uVar7) && (((long)*piVar3 + uVar7) - 3 < (ulong)(long)this->width)) {
    flash();
    pWVar4 = this->visualWin;
    if (pWVar4 == (WINDOW *)0x0) {
      iVar5 = -1;
      iVar8 = -1;
    }
    else {
      iVar5 = (int)pWVar4->_begy;
      iVar8 = (int)pWVar4->_begx;
    }
    piVar3 = (this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    auVar9 = newwin(1,1,piVar3[1] + iVar5,
                    (int)((ulong)((long)(this->in).super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_finish - (long)piVar3) >>
                         2) + *piVar3 + iVar8 + -3);
    this->highlight = auVar9._0_8_;
    iVar6 = local_1c * 0x100 + 0x600;
    wbkgd(auVar9._0_8_,(short)iVar6,auVar9._8_8_,iVar6);
    mvwprintw(this->highlight,iVar5,
              (int)((ulong)((long)(this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2) + iVar8 + -3," ");
    wrefresh(this->highlight);
    delwin(this->highlight);
  }
  return;
}

Assistant:

void visualOutput::takeValue() {
	int val = outArr->nodeGet(OUTPUT_ID);
	in.push_back(val);

	if (val == -1)
		in.clear();

	if (in.size() > 2 && in[0] + in.size() - 3 < width) {
		flash();
		int y,x;
		getbegyx(visualWin, y, x);
		highlight = newwin(1, 1, in[1] + y, in[0] + in.size() - 3 + x);
		wbkgd(highlight, COLOR_PAIR(val + 6));
		mvwprintw(highlight, y, x + in.size() - 3, " ");
		wrefresh(highlight);
		delwin(highlight);
	}

	return;
}